

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3_trace(sqlite3 *db,_func_void_void_ptr_char_ptr *xTrace,void *pArg)

{
  void *pvVar1;
  sqlite3_mutex *psVar2;
  
  if (db->mutex == (sqlite3_mutex *)0x0) {
    psVar2 = (sqlite3_mutex *)0x0;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    psVar2 = db->mutex;
  }
  pvVar1 = db->pTraceArg;
  db->mTrace = (xTrace != (_func_void_void_ptr_char_ptr *)0x0) << 7;
  db->xTrace = (_func_int_u32_void_ptr_void_ptr_void_ptr *)xTrace;
  db->pTraceArg = pArg;
  if (psVar2 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar2);
  }
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_trace(sqlite3 *db, void(*xTrace)(void*,const char*), void *pArg){
  void *pOld;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pOld = db->pTraceArg;
  db->mTrace = xTrace ? SQLITE_TRACE_LEGACY : 0;
  db->xTrace = (int(*)(u32,void*,void*,void*))xTrace;
  db->pTraceArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pOld;
}